

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CascOpenStorage.cpp
# Opt level: O1

bool CascGetStorageInfo(HANDLE hStorage,CASC_STORAGE_INFO_CLASS InfoClass,void *pvStorageInfo,
                       size_t cbStorageInfo,size_t *pcbLengthNeeded)

{
  int iVar1;
  uint uVar2;
  HANDLE pvVar3;
  DWORD dwErrCode;
  
  if ((hStorage == (HANDLE)0x0) || (*hStorage == (char *)0x0)) {
    pvVar3 = (HANDLE)0x0;
  }
  else {
    iVar1 = strcmp(*hStorage,"TCascStorage");
    pvVar3 = (HANDLE)0x0;
    if (iVar1 == 0) {
      pvVar3 = hStorage;
    }
  }
  if (pvVar3 == (HANDLE)0x0) {
    dwErrCode = 9;
  }
  else {
    switch(InfoClass) {
    case CascStorageFileCount:
      uVar2 = *(uint *)(*(long *)((long)pvVar3 + 0xd40) + 8);
      break;
    case CascStorageFeatures:
      uVar2 = *(uint *)(*(long *)((long)pvVar3 + 0xd60) + 8) & 1;
      break;
    case CascStorageGameInfo:
      uVar2 = *(uint *)((long)pvVar3 + 0x34);
      break;
    case CascStorageGameBuild:
      uVar2 = *(uint *)((long)pvVar3 + 0x38);
      break;
    case CascStorageInstalledLocales:
      uVar2 = *(uint *)((long)pvVar3 + 0x40);
      break;
    default:
      dwErrCode = 0x16;
      goto LAB_001144db;
    }
    if (3 < cbStorageInfo) {
      *(uint *)pvStorageInfo = uVar2;
      return true;
    }
    *pcbLengthNeeded = 4;
    dwErrCode = 0x69;
  }
LAB_001144db:
  SetLastError(dwErrCode);
  return false;
}

Assistant:

bool WINAPI CascGetStorageInfo(
    HANDLE hStorage,
    CASC_STORAGE_INFO_CLASS InfoClass,
    void * pvStorageInfo,
    size_t cbStorageInfo,
    size_t * pcbLengthNeeded)
{
    TCascStorage * hs;
    DWORD dwInfoValue = 0;

    // Verify the storage handle
    hs = IsValidCascStorageHandle(hStorage);
    if(hs == NULL)
    {
        SetLastError(ERROR_INVALID_HANDLE);
        return false;
    }

    // Differentiate between info classes
    switch(InfoClass)
    {
        case CascStorageFileCount:
            dwInfoValue = (DWORD)hs->pEKeyEntryMap->ItemCount;
            break;

        case CascStorageFeatures:
            dwInfoValue |= (hs->pRootHandler->GetFlags() & ROOT_FLAG_HAS_NAMES) ? CASC_FEATURE_HAS_NAMES : 0;
            break;

        case CascStorageGameInfo:
            dwInfoValue = hs->dwGameInfo;
            break;

        case CascStorageGameBuild:
            dwInfoValue = hs->dwBuildNumber;
            break;

        case CascStorageInstalledLocales:
            dwInfoValue = hs->dwDefaultLocale;
            break;

        default:
            SetLastError(ERROR_INVALID_PARAMETER);
            return false;
    }

    //
    // Return the required DWORD value
    //

    if(cbStorageInfo < sizeof(DWORD))
    {
        *pcbLengthNeeded = sizeof(DWORD);
        SetLastError(ERROR_INSUFFICIENT_BUFFER);
        return false;
    }

    // Give the number of files
    *(PDWORD)pvStorageInfo = dwInfoValue;
    return true;
}